

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbgtool.c
# Opt level: O2

LispPTR get_ivar_name(frameex1 *fx_addr68k,DLword offset,int *localivar)

{
  LispPTR *pLVar1;
  LispPTR *pLVar2;
  ulong uVar3;
  LispPTR *pLVar4;
  uint uVar5;
  int iVar6;
  bool bVar7;
  
  pLVar1 = NativeAligned4FromLAddr(fx_addr68k->fnheader);
  uVar3 = (ulong)*(ushort *)((long)pLVar1 + 0xe);
  if (uVar3 == 0) {
    pLVar4 = pLVar1 + (long)((int)((ushort)pLVar1[1] - 0x18) >> 3) + 6;
    pLVar2 = pLVar1 + 6;
  }
  else {
    uVar5 = (uint)*(ushort *)((long)pLVar1 + 0xe);
    pLVar2 = pLVar1 + 4;
    while (bVar7 = uVar5 != 0, uVar5 = uVar5 - 1, bVar7) {
      if (*(uint *)((long)pLVar2 + uVar3 * 2) == (uint)offset) {
        iVar6 = 0;
        if (*pLVar2 != 0) goto LAB_00111bb8;
        break;
      }
      pLVar2 = pLVar2 + 1;
    }
    pLVar2 = pLVar1 + 4 + uVar3;
    pLVar4 = pLVar2 + ((long)((long)pLVar1 +
                             ((ulong)((ushort)pLVar1[1] & 0xfffffffe) - (long)pLVar2)) >> 3);
  }
  iVar6 = 1;
  for (; *pLVar4 != (uint)offset; pLVar4 = pLVar4 + 1) {
    pLVar2 = pLVar2 + 1;
  }
LAB_00111bb8:
  *localivar = iVar6;
  return *pLVar2;
}

Assistant:

LispPTR get_ivar_name(struct frameex1 *fx_addr68k, DLword offset, int *localivar) {
  NAMETABLE *first_table;
  NAMETABLE *second_table;
  struct fnhead *fnobj;
  int i;
#ifdef BIGVM
  fnobj = (struct fnhead *)NativeAligned4FromLAddr((fx_addr68k)->fnheader);
#else
  fnobj = (struct fnhead *)NativeAligned4FromLAddr(((int)(fx_addr68k)->hi2fnheader << 16) |
                                              (fx_addr68k)->lofnheader);
#endif /* BIGVM */
  if (fnobj->ntsize > 0) {
    /* name table exists */
    first_table = (NAMETABLE *)(fnobj + 1);
    second_table = (NAMETABLE *)((DLword *)first_table + fnobj->ntsize);

    for (i = 0; (i < fnobj->ntsize) && (GetNTEntry(second_table) != offset);
         first_table++, second_table++, i++)
      ;
    if ((i < fnobj->ntsize) && (GetNTEntry(first_table) != 0)) {
      /* target ivar was in name table */
      *localivar = 0;
      return ((LispPTR)(GetNTEntry(first_table)));
    } else {
/* Target ivar is in locar vars table */
#ifdef BIGATOMS
      first_table = (NAMETABLE *)(fnobj + 1) + (fnobj->ntsize);
      second_table =
          first_table + (((DLword *)fnobj + (fnobj->startpc >> 1) - (DLword *)first_table) >> 2);
#else
      first_table = (NAMETABLE *)(fnobj + 1) + (fnobj->ntsize << 1);
      second_table = first_table + (((DLword *)fnobj + (fnobj->startpc >> 1) - first_table) >> 1);
#endif
    }
  } else {
/* name table doesn't exist, so all ivars are in locar vars table */
#ifdef BIGATOMS
    int delta;
    first_table = (NAMETABLE *)(fnobj + 1) + (4 >> 1);
    delta = (DLword *)(((DLword *)fnobj) + (fnobj->startpc >> 1)) - (DLword *)first_table;
    second_table = first_table + (delta >> 2);
#else
    first_table = (NAMETABLE *)(fnobj + 1) + 4;
    second_table = first_table + (((DLword *)fnobj + (fnobj->startpc >> 1) - first_table) >> 1);
#endif
  }
#ifdef BIGATOMS
  while (*(second_table) != (VTY_IVAR | offset))
#else
  while (GETWORD(second_table) != (VTY_IVAR | offset))
#endif /* BIGATOMS */

  {
    first_table++;
    second_table++;
  }
  *localivar = 1;

#ifdef BIGATOMS
  return ((LispPTR)(*(first_table)));
#else
  return ((LispPTR)(GETWORD(first_table)));
#endif /* BIGATOMS */

}